

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O3

int imcomp_convert_tile_tsbyte
              (fitsfile *outfptr,void *tiledata,long tilelen,int nullcheck,void *nullflagval,
              int nullval,int zbitpix,double scale,double zero,int *intlength,int *status)

{
  byte *pbVar1;
  char cVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  void *__src;
  long lVar6;
  char cVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  
  if ((((zbitpix != 8) || (scale != 1.0)) || (NAN(scale))) || ((zero != -128.0 || (NAN(zero))))) {
    ffpmsg("Implicit datatype conversion is not supported when writing to compressed images");
    *status = 0x19d;
    iVar5 = 0x19d;
  }
  else {
    uVar10 = (ulong)(uint)outfptr->Fptr->compress_type;
    if ((uVar10 < 0x34) && ((0x8000000600800U >> (uVar10 & 0x3f) & 1) != 0)) {
      *intlength = 1;
      if (nullcheck == 1) {
        if (0 < tilelen) {
          cVar2 = *nullflagval;
          uVar10 = tilelen + 1;
          do {
            cVar3 = *(char *)((long)tiledata + (uVar10 - 2));
            cVar7 = cVar3 + -0x80;
            if (cVar3 == cVar2) {
              cVar7 = (char)nullval;
            }
            *(char *)((long)tiledata + (uVar10 - 2)) = cVar7;
            uVar10 = uVar10 - 1;
          } while (1 < uVar10);
        }
      }
      else if (0 < tilelen) {
        uVar10 = tilelen + 1;
        do {
          pbVar1 = (byte *)((long)tiledata + (uVar10 - 2));
          *pbVar1 = *pbVar1 ^ 0x80;
          uVar10 = uVar10 - 1;
        } while (1 < uVar10);
      }
    }
    else {
      *intlength = 4;
      if (nullcheck == 1) {
        if (0 < tilelen) {
          cVar2 = *nullflagval;
          uVar10 = tilelen + 1;
          do {
            cVar3 = *(char *)((long)tiledata + (uVar10 - 2));
            iVar5 = cVar3 + 0x80;
            if (cVar3 == cVar2) {
              iVar5 = nullval;
            }
            *(int *)((long)tiledata + uVar10 * 4 + -8) = iVar5;
            uVar10 = uVar10 - 1;
          } while (1 < uVar10);
        }
      }
      else if (*status < 1) {
        lVar9 = 10000;
        if (tilelen < 10000) {
          lVar9 = tilelen;
        }
        __src = malloc(lVar9 * 4);
        if (__src == (void *)0x0) {
          ffpmsg("Out of memory. (fits_sbyte_to_int_inplace)");
          *status = 0x71;
        }
        else {
          if (0 < tilelen) {
            lVar11 = tilelen - lVar9;
            do {
              lVar6 = 1;
              if (1 < lVar9) {
                lVar6 = lVar9;
              }
              lVar8 = 0;
              do {
                *(int *)((long)__src + lVar8 * 4) =
                     *(char *)((long)tiledata + lVar8 + lVar11) + 0x80;
                lVar8 = lVar8 + 1;
              } while (lVar6 != lVar8);
              memcpy((void *)((long)tiledata + lVar11 * 4),__src,lVar9 * 4);
              if (lVar11 < 0x2711) {
                lVar9 = lVar11;
              }
              bVar4 = lVar11 < 0x2711;
              lVar11 = lVar11 + -10000;
              if (bVar4) {
                lVar11 = 0;
              }
            } while (0 < lVar9);
          }
          free(__src);
        }
      }
    }
    iVar5 = *status;
  }
  return iVar5;
}

Assistant:

int imcomp_convert_tile_tsbyte(
    fitsfile *outfptr,
    void *tiledata, 
    long tilelen,
    int nullcheck,
    void *nullflagval,
    int nullval,
    int zbitpix,
    double scale,
    double zero,
    int *intlength,
    int *status)
{
    /*  Prepare the input tile array of pixels for compression. */
    /*  Convert input integer*1 tile array in place to 4 or 8-byte ints for compression, */
    /*  If needed, convert 4 or 8-byte ints and do null value substitution. */
    /*  Note that the calling routine must have allocated the input array big enough */
    /* to be able to do this.  */

    int flagval, *idata;
    long ii;
    signed char *sbbuff;

       /* datatype of input array is signed byte.  We only support writing this datatype
          to a FITS image with BITPIX = 8 and with BZERO = 0 and BSCALE = -128.  */

       if (zbitpix != BYTE_IMG|| scale != 1.0 || zero != -128.) {
           ffpmsg("Implicit datatype conversion is not supported when writing to compressed images");
           return(*status = DATA_COMPRESSION_ERR);
       }

       idata = (int *) tiledata;
       sbbuff = (signed char *) tiledata;

       if ( (outfptr->Fptr)->compress_type == RICE_1 || (outfptr->Fptr)->compress_type == GZIP_1
         || (outfptr->Fptr)->compress_type == GZIP_2 || (outfptr->Fptr)->compress_type == BZIP2_1 ) 
       {
           /* don't have to convert to int if using gzip, bzip2 or Rice compression */
           *intlength = 1;
             
           if (nullcheck == 1) {
               /* reset pixels equal to flagval to the FITS null value, prior to compression */
               /* offset the other pixel values (by flipping the MSB) */

               flagval = *(signed char *) (nullflagval);
               for (ii = tilelen - 1; ii >= 0; ii--) {
	            if (sbbuff[ii] == (signed char) flagval)
		       sbbuff[ii] = (signed char) nullval;
                    else
		       sbbuff[ii] = (sbbuff[ii]) ^ 0x80;               }
           } else {  /* just offset the pixel values (by flipping the MSB) */
               for (ii = tilelen - 1; ii >= 0; ii--) 
		       sbbuff[ii] = (sbbuff[ii]) ^ 0x80;
           }

       } else {
           /* have to convert to int if using HCOMPRESS or PLIO */
           *intlength = 4;

           if (nullcheck == 1) {
               /* reset pixels equal to flagval to the FITS null value, prior to compression */
               flagval = *(signed char *) (nullflagval);
               for (ii = tilelen - 1; ii >= 0; ii--) {
	            if (sbbuff[ii] == (signed char) flagval)
		       idata[ii] = nullval;
                    else
                       idata[ii] = ((int) sbbuff[ii]) + 128;
               }
           } else {  /* just do the data type conversion to int */
                 /* have to convert sbbuff to an I*4 array, in place */
                 /* sbbuff must have been allocated large enough to do this */
                 fits_sbyte_to_int_inplace(sbbuff, tilelen, status);
           }
       }
 
       return(*status);
}